

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::QuadsDrawTL(CGraphics_Threaded *this,CQuadItem *pArray,int Num)

{
  long lVar1;
  float fVar2;
  int in_EDX;
  int iVar3;
  CVertex *in_RSI;
  CGraphics_Threaded *in_RDI;
  long in_FS_OFFSET;
  int i;
  CPoint Center;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_28;
  CGraphics_Threaded *rCenter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rCenter = in_RDI;
  dbg_assert_imp((char *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x130075
                );
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4].m_Pos.x =
         (&in_RSI->m_Pos)[(long)local_28 * 2].x;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4].m_Pos.y =
         (&in_RSI->m_Pos)[(long)local_28 * 2].y;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4;
    fVar2 = in_RDI->m_aTexture[0].v;
    in_RDI->m_aVertices[iVar3].m_Tex.u = in_RDI->m_aTexture[0].u;
    in_RDI->m_aVertices[iVar3].m_Tex.v = fVar2;
    in_RDI->m_aVertices[iVar3].m_Tex.i = in_RDI->m_aTexture[0].i;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4;
    fVar2 = in_RDI->m_aColor[0].g;
    in_RDI->m_aVertices[iVar3].m_Color.r = in_RDI->m_aColor[0].r;
    in_RDI->m_aVertices[iVar3].m_Color.g = fVar2;
    fVar2 = in_RDI->m_aColor[0].a;
    in_RDI->m_aVertices[iVar3].m_Color.b = in_RDI->m_aColor[0].b;
    in_RDI->m_aVertices[iVar3].m_Color.a = fVar2;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 1].m_Pos.x =
         (&in_RSI->m_Pos)[(long)local_28 * 2].x +
         *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10);
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 1].m_Pos.y =
         (&in_RSI->m_Pos)[(long)local_28 * 2].y;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 1;
    fVar2 = in_RDI->m_aTexture[1].v;
    in_RDI->m_aVertices[iVar3].m_Tex.u = in_RDI->m_aTexture[1].u;
    in_RDI->m_aVertices[iVar3].m_Tex.v = fVar2;
    in_RDI->m_aVertices[iVar3].m_Tex.i = in_RDI->m_aTexture[1].i;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 1;
    fVar2 = in_RDI->m_aColor[1].g;
    in_RDI->m_aVertices[iVar3].m_Color.r = in_RDI->m_aColor[1].r;
    in_RDI->m_aVertices[iVar3].m_Color.g = fVar2;
    fVar2 = in_RDI->m_aColor[1].a;
    in_RDI->m_aVertices[iVar3].m_Color.b = in_RDI->m_aColor[1].b;
    in_RDI->m_aVertices[iVar3].m_Color.a = fVar2;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 2].m_Pos.x =
         (&in_RSI->m_Pos)[(long)local_28 * 2].x +
         *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10);
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 2].m_Pos.y =
         (&in_RSI->m_Pos)[(long)local_28 * 2].y +
         *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10 + 4);
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 2;
    fVar2 = in_RDI->m_aTexture[2].v;
    in_RDI->m_aVertices[iVar3].m_Tex.u = in_RDI->m_aTexture[2].u;
    in_RDI->m_aVertices[iVar3].m_Tex.v = fVar2;
    in_RDI->m_aVertices[iVar3].m_Tex.i = in_RDI->m_aTexture[2].i;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 2;
    fVar2 = in_RDI->m_aColor[2].g;
    in_RDI->m_aVertices[iVar3].m_Color.r = in_RDI->m_aColor[2].r;
    in_RDI->m_aVertices[iVar3].m_Color.g = fVar2;
    fVar2 = in_RDI->m_aColor[2].a;
    in_RDI->m_aVertices[iVar3].m_Color.b = in_RDI->m_aColor[2].b;
    in_RDI->m_aVertices[iVar3].m_Color.a = fVar2;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 3].m_Pos.x =
         (&in_RSI->m_Pos)[(long)local_28 * 2].x;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_28 * 4 + 3].m_Pos.y =
         (&in_RSI->m_Pos)[(long)local_28 * 2].y +
         *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10 + 4);
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 3;
    fVar2 = in_RDI->m_aTexture[3].v;
    in_RDI->m_aVertices[iVar3].m_Tex.u = in_RDI->m_aTexture[3].u;
    in_RDI->m_aVertices[iVar3].m_Tex.v = fVar2;
    in_RDI->m_aVertices[iVar3].m_Tex.i = in_RDI->m_aTexture[3].i;
    iVar3 = in_RDI->m_NumVertices + local_28 * 4 + 3;
    fVar2 = in_RDI->m_aColor[3].g;
    in_RDI->m_aVertices[iVar3].m_Color.r = in_RDI->m_aColor[3].r;
    in_RDI->m_aVertices[iVar3].m_Color.g = fVar2;
    fVar2 = in_RDI->m_aColor[3].a;
    in_RDI->m_aVertices[iVar3].m_Color.b = in_RDI->m_aColor[3].b;
    in_RDI->m_aVertices[iVar3].m_Color.a = fVar2;
    if ((in_RDI->m_Rotation != 0.0) || (NAN(in_RDI->m_Rotation))) {
      Rotate4((CGraphics_Threaded *)
              CONCAT44((&in_RSI->m_Pos)[(long)local_28 * 2].y +
                       *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10 + 4) / 2.0,
                       (&in_RSI->m_Pos)[(long)local_28 * 2].x +
                       *(float *)((long)&in_RSI->m_Tex + (long)local_28 * 0x10) / 2.0),
              (CPoint *)rCenter,in_RSI);
    }
  }
  AddVertices(in_RDI,in_stack_ffffffffffffffcc);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGraphics_Threaded::QuadsDrawTL(const CQuadItem *pArray, int Num)
{
	CCommandBuffer::CPoint Center;

	dbg_assert(m_Drawing == DRAWING_QUADS, "called Graphics()->QuadsDrawTL without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 4*i].m_Pos.x = pArray[i].m_X;
		m_aVertices[m_NumVertices + 4*i].m_Pos.y = pArray[i].m_Y;
		m_aVertices[m_NumVertices + 4*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 4*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.x = pArray[i].m_X + pArray[i].m_Width;
		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.y = pArray[i].m_Y;
		m_aVertices[m_NumVertices + 4*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 4*i + 1].m_Color = m_aColor[1];

		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.x = pArray[i].m_X + pArray[i].m_Width;
		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.y = pArray[i].m_Y + pArray[i].m_Height;
		m_aVertices[m_NumVertices + 4*i + 2].m_Tex = m_aTexture[2];
		m_aVertices[m_NumVertices + 4*i + 2].m_Color = m_aColor[2];

		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.x = pArray[i].m_X;
		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.y = pArray[i].m_Y + pArray[i].m_Height;
		m_aVertices[m_NumVertices + 4*i + 3].m_Tex = m_aTexture[3];
		m_aVertices[m_NumVertices + 4*i + 3].m_Color = m_aColor[3];

		if(m_Rotation != 0)
		{
			Center.x = pArray[i].m_X + pArray[i].m_Width/2;
			Center.y = pArray[i].m_Y + pArray[i].m_Height/2;

			Rotate4(Center, &m_aVertices[m_NumVertices + 4*i]);
		}
	}

	AddVertices(4*Num);
}